

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O1

int64_t av1_interpolation_filter_search
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *tmp_dst,BUFFER_SET *orig_dst,int64_t *rd,int *switchable_rate,
                  int *skip_build_pred,HandleInterModeArgs *args,int64_t ref_best_rd)

{
  MACROBLOCKD *xd;
  uint8_t uVar1;
  char cVar2;
  InterpFilter IVar3;
  TransformationType TVar4;
  COMPOUND_TYPE CVar5;
  undefined2 uVar6;
  ushort uVar7;
  MB_MODE_INFO *pMVar8;
  int64_t (*paaiVar9) [3] [8];
  MB_MODE_INFO *pMVar10;
  MB_MODE_INFO *pMVar11;
  MB_MODE_INFO *pMVar12;
  undefined8 uVar13;
  macroblockd_plane *pmVar14;
  BUFFER_SET *pBVar15;
  BUFFER_SET *pBVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  buf_2d *pbVar20;
  int *switchable_ctx_00;
  int64_t iVar21;
  InterpFilter IVar22;
  byte bVar23;
  BLOCK_SIZE bsize_00;
  uint16_t uVar24;
  uint uVar25;
  long lVar26;
  int *piVar27;
  scale_factors *psVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  BUFFER_SET **ppBVar34;
  uint uVar35;
  TileDataEnc *tile_data_00;
  uint uVar36;
  InterpFilters IVar37;
  InterpFilters IVar38;
  int8_t *piVar39;
  uint16_t uVar40;
  undefined1 *puVar41;
  uint8_t *puVar42;
  int iVar43;
  int skip_pred;
  ulong uVar44;
  BUFFER_SET **dst_bufs_00;
  uint uVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  int in_stack_fffffffffffffe58;
  int switchable_ctx [2];
  RD_STATS rd_stats;
  BUFFER_SET *dst_bufs [2];
  RD_STATS rd_stats_luma;
  RD_STATS local_c8;
  INTERPOLATION_FILTER_STATS *local_98;
  ulong local_90;
  uint local_88;
  uint local_84;
  int local_80;
  int local_7c;
  MB_MODE_INFO **local_78;
  AV1_COMMON *local_70;
  BUFFER_SET *local_68;
  int *local_60;
  SequenceHeader *local_58;
  uint8_t *local_50;
  scale_factors *local_48;
  MB_MODE_INFO *local_40;
  long local_38;
  
  pMVar8 = *(x->e_mbd).mi;
  if (((pMVar8->field_0xa7 & 0x40) == 0) && (pMVar8->motion_mode != '\x02')) {
    bVar50 = true;
    if ((pMVar8->mode == '\x17') || (pMVar8->mode == '\x0f')) {
      bVar23 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar8->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar8->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar8->bsize]) {
        bVar23 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar8->bsize];
      }
      if (1 < bVar23) {
        lVar19 = 0;
        do {
          TVar4 = (x->e_mbd).global_motion[pMVar8->ref_frame[lVar19]].wmtype;
          bVar50 = TVar4 == '\x01';
          if ((bVar50) || (pMVar8->ref_frame[1] < '\x01')) break;
          bVar51 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar51);
        bVar51 = TVar4 != '\x01';
        goto LAB_003bbf8f;
      }
    }
    bVar51 = false;
  }
  else {
    bVar50 = false;
    bVar51 = true;
  }
LAB_003bbf8f:
  uVar1 = ((cpi->common).seq_params)->monochrome;
  cVar2 = pMVar8->ref_frame[0];
  rd_stats_luma.rate = 0;
  rd_stats_luma.zero_rate = 0;
  rd_stats_luma.dist = 0;
  rd_stats_luma.rdcost = 0;
  rd_stats_luma.sse = 0;
  rd_stats_luma.skip_txfm = '\x01';
  rd_stats.rate = 0;
  rd_stats.zero_rate = 0;
  rd_stats.dist = 0;
  rd_stats.rdcost = 0;
  rd_stats.sse = 0;
  rd_stats.skip_txfm = '\x01';
  IVar3 = (cpi->common).features.interp_filter;
  local_98 = args->interp_filter_stats;
  iVar17 = (cpi->sf).interp_sf.use_interp_filter;
  iVar43 = -1;
  if (bVar50 && (long)iVar17 != 0) {
    iVar18 = -1;
    if (0 < args->interp_filter_stats_idx) {
      bVar50 = '\0' < pMVar8->ref_frame[1];
      uVar31 = (ulong)bVar50;
      lVar19 = uVar31 + 1;
      piVar39 = args->interp_filter_stats[0].ref_frames;
      puVar41 = (undefined1 *)((long)args->interp_filter_stats[0].mv + 2);
      uVar32 = 0xffffffff;
      iVar43 = 0x7fffffff;
      uVar44 = 0;
      do {
        lVar46 = 0;
        do {
          iVar33 = 0x7fffffff;
          if (piVar39[lVar46] != pMVar8->ref_frame[lVar46]) goto LAB_003bc13d;
          lVar46 = lVar46 + 1;
        } while (lVar19 != lVar46);
        if ((!bVar50 || iVar17 != 1) ||
           ((local_98[uVar44].comp_type == (pMVar8->interinter_comp).type &&
            (local_98[uVar44].compound_idx == (uint)((*(ushort *)&pMVar8->field_0xa7 >> 9 & 1) != 0)
            )))) {
          lVar46 = 0;
          iVar33 = 0;
          do {
            uVar47 = (int)*(short *)(puVar41 + lVar46 * 4 + -2) - (int)pMVar8->mv[lVar46].as_mv.row;
            uVar35 = -uVar47;
            if (0 < (int)uVar47) {
              uVar35 = uVar47;
            }
            uVar48 = (int)*(short *)(puVar41 + lVar46 * 4) -
                     (int)*(short *)((long)pMVar8->mv + lVar46 * 4 + 2);
            uVar47 = -uVar48;
            if (0 < (int)uVar48) {
              uVar47 = uVar48;
            }
            iVar33 = (uVar35 & 0xffff) + iVar33 + (uVar47 & 0xffff);
            lVar46 = lVar46 + 1;
          } while (lVar19 != lVar46);
        }
LAB_003bc13d:
        if (iVar33 == 0) {
          uVar32 = uVar44 & 0xffffffff;
        }
        else if ((iVar33 < iVar43) &&
                (iVar33 <= av1_refine_integerized_param::max_trans_model_params
                           [uVar31 + (long)iVar17 * 2 + 2])) {
          uVar32 = uVar44 & 0xffffffff;
          iVar43 = iVar33;
        }
        iVar18 = (int)uVar32;
        if (iVar33 == 0) break;
        uVar44 = uVar44 + 1;
        piVar39 = piVar39 + 0x28;
        puVar41 = puVar41 + 0x28;
      } while (uVar44 != (uint)args->interp_filter_stats_idx);
    }
    iVar43 = -1;
    if (iVar18 != -1) {
      pMVar8->interp_filters = local_98[iVar18].filters;
      iVar43 = iVar18;
    }
  }
  if (!(bool)(~bVar51 & iVar43 != -1)) {
    IVar22 = IVar3;
    if (IVar3 == MULTITAP_SHARP2) {
      IVar22 = EIGHTTAP_REGULAR;
    }
    (pMVar8->interp_filters).as_int = (uint)IVar22 << 0x10 | (uint)IVar22;
  }
  if (iVar43 != -1) {
    *rd = args->interp_filter_stats[iVar43].rd;
    x->pred_sse[cVar2] = args->interp_filter_stats[iVar43].pred_sse;
    *skip_build_pred = 0;
    return 0;
  }
  xd = &x->e_mbd;
  local_68 = tmp_dst;
  iVar17 = av1_get_pred_context_switchable_interp(xd,0);
  iVar43 = 0x3bc263;
  switchable_ctx[0] = iVar17;
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd,1);
  iVar17 = (x->mode_costs).switchable_interp_costs[iVar17][(pMVar8->interp_filters).as_int & 0xff];
  if (((cpi->common).seq_params)->enable_dual_filter != '\0') {
    iVar17 = iVar17 + *(int *)((long)(x->mode_costs).switchable_interp_costs[switchable_ctx[1]] +
                              (ulong)((pMVar8->interp_filters).as_int >> 0xe & 0x3fc));
  }
  *switchable_rate = iVar17;
  local_c8.rate = 0;
  local_c8.zero_rate = 0;
  local_c8.dist = 0;
  local_c8.rdcost = 0;
  local_c8.sse = 0;
  local_c8.skip_txfm = 1;
  tile_data_00 = (TileDataEnc *)(ulong)bsize;
  if (*skip_build_pred == 0) {
    iVar43 = 0;
    av1_enc_build_inter_predictor
              (&cpi->common,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize,0,0);
  }
  local_70 = &cpi->common;
  (*model_rd_sb_fn[(cpi->sf).rt_sf.use_simple_rd_model == 0])
            (cpi,bsize,x,xd,0,0,&local_c8.rate,&local_c8.dist,&local_c8.skip_txfm,&local_c8.sse,
             (int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
  if (local_c8.rate == 0x7fffffff) {
    rd_stats_luma.rate = 0x7fffffff;
    rd_stats_luma.zero_rate = 0;
    rd_stats_luma.dist = 0x7fffffffffffffff;
    rd_stats_luma.rdcost = 0x7fffffffffffffff;
    rd_stats_luma.sse = 0x7fffffffffffffff;
    rd_stats_luma.skip_txfm = '\0';
  }
  else {
    rd_stats_luma.rate = local_c8.rate;
    rd_stats_luma.zero_rate = local_c8.zero_rate;
    rd_stats_luma.dist = rd_stats_luma.dist + local_c8.dist;
    if ((rd_stats_luma.sse != 0x7fffffffffffffff) && (local_c8.sse != 0x7fffffffffffffff)) {
      rd_stats_luma.sse = local_c8.sse + rd_stats_luma.sse;
    }
    rd_stats_luma.skip_txfm = local_c8.skip_txfm & 1;
  }
  if (uVar1 == '\0') {
    local_c8.rate = 0;
    local_c8.zero_rate = 0;
    local_c8.dist = 0;
    local_c8.rdcost = 0;
    local_c8.sse = 0;
    local_c8.skip_txfm = '\x01';
    if (*skip_build_pred == 0) {
      iVar43 = 2;
      av1_enc_build_inter_predictor
                (local_70,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize,1,2);
    }
    (*model_rd_sb_fn[(cpi->sf).rt_sf.use_simple_rd_model == 0])
              (cpi,bsize,x,xd,1,2,&local_c8.rate,&local_c8.dist,&local_c8.skip_txfm,&local_c8.sse,
               (int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
    if (local_c8.rate == 0x7fffffff) {
      rd_stats.rate = 0x7fffffff;
      rd_stats.zero_rate = 0;
      rd_stats.dist = 0x7fffffffffffffff;
      rd_stats.rdcost = 0x7fffffffffffffff;
      rd_stats.sse = 0x7fffffffffffffff;
      rd_stats.skip_txfm = '\0';
    }
    else {
      rd_stats.rate = local_c8.rate;
      rd_stats.zero_rate = local_c8.zero_rate;
      rd_stats.dist = rd_stats.dist + local_c8.dist;
      if ((rd_stats.sse != 0x7fffffffffffffff) && (local_c8.sse != 0x7fffffffffffffff)) {
        rd_stats.sse = local_c8.sse + rd_stats.sse;
      }
      rd_stats.skip_txfm = local_c8.skip_txfm & 1;
    }
  }
  *skip_build_pred = 1;
  if ((long)rd_stats.rate == 0x7fffffff) {
LAB_003bc65a:
    rd_stats.rate = 0x7fffffff;
    rd_stats.zero_rate = 0;
    rd_stats.dist = 0x7fffffffffffffff;
    rd_stats.rdcost = 0x7fffffffffffffff;
    rd_stats.sse = 0x7fffffffffffffff;
    rd_stats.skip_txfm = '\0';
  }
  else {
    if ((long)rd_stats_luma.rate == 0x7fffffff) goto LAB_003bc65a;
    lVar19 = (long)rd_stats_luma.rate + (long)rd_stats.rate;
    if (0x7ffffffe < lVar19) {
      lVar19 = 0x7fffffff;
    }
    if (rd_stats.zero_rate == 0) {
      rd_stats.zero_rate = rd_stats_luma.zero_rate;
    }
    rd_stats.rate = (int)lVar19;
    rd_stats.dist = rd_stats.dist + rd_stats_luma.dist;
    if ((rd_stats.sse != 0x7fffffffffffffff) && (rd_stats_luma.sse != 0x7fffffffffffffff)) {
      rd_stats.sse = rd_stats_luma.sse + rd_stats.sse;
    }
    rd_stats.skip_txfm = rd_stats.skip_txfm & rd_stats_luma.skip_txfm;
  }
  lVar19 = rd_stats.dist * 0x80 +
           ((long)x->rdmult * ((long)rd_stats.rate + (long)*switchable_rate) + 0x100 >> 9);
  *rd = lVar19;
  x->pred_sse[cVar2] = (uint)((ulong)rd_stats_luma.sse >> 4);
  if (bVar51 || IVar3 != MULTITAP_SHARP2) {
    return 0;
  }
  paaiVar9 = args->modelled_rd;
  if ((paaiVar9 != (int64_t (*) [3] [8])0x0) && (0 < (long)pMVar8->ref_frame[1])) {
    uVar35 = (*(ushort *)&pMVar8->field_0xa7 & 0x30) << 2;
    lVar46 = *(long *)((long)(*paaiVar9)[0] +
                      (long)pMVar8->ref_frame[0] * 8 +
                      (ulong)((uint)(byte)compound_ref0_mode_lut[pMVar8->mode] * 0xc0) +
                      (ulong)uVar35);
    lVar26 = *(long *)((long)(*paaiVar9)[0] +
                      (long)pMVar8->ref_frame[1] * 8 +
                      (ulong)((uint)(byte)compound_ref1_mode_lut[pMVar8->mode] * 0xc0) +
                      (ulong)uVar35);
    if (lVar46 < lVar26) {
      lVar26 = lVar46;
    }
    if ((ref_best_rd != 0x7fffffffffffffff) && (lVar26 < lVar19 >> 1)) {
      return 0x7fffffffffffffff;
    }
  }
  x->recalc_luma_mc_data = 0;
  uVar35 = (cpi->interp_search_flags).default_interp_skip_flags;
  local_60 = (int *)(ulong)uVar35;
  local_78 = (x->e_mbd).mi;
  local_40 = *local_78;
  local_58 = (cpi->common).seq_params;
  local_48 = (cpi->common).ref_scale_factors;
  local_50 = &(x->e_mbd).plane[0].height;
  piVar27 = (int *)(ulong)uVar35;
  lVar19 = 0;
  do {
    local_84 = (uint)piVar27;
    iVar17 = -1;
    if ((byte)(local_40->ref_frame[lVar19] - 1U) < 8) {
      iVar17 = (cpi->common).remapped_ref_idx[(byte)local_40->ref_frame[lVar19] - 1];
    }
    psVar28 = (scale_factors *)0x0;
    if (iVar17 != -1) {
      psVar28 = local_48 + iVar17;
    }
    bVar50 = true;
    if ((psVar28->x_scale_fp != -1) && (psVar28->y_scale_fp != -1)) {
      bVar50 = psVar28->y_scale_fp == 0x4000 && psVar28->x_scale_fp == 0x4000;
    }
    piVar27 = (int *)0x0;
    uVar47 = 0;
    if (bVar50) {
      local_88 = uVar35;
      local_38 = lVar19;
      iVar17 = (x->e_mbd).mb_to_right_edge;
      local_90 = CONCAT44(local_90._4_4_,iVar17);
      local_7c = (x->e_mbd).mb_to_top_edge;
      local_80 = (x->e_mbd).mb_to_bottom_edge;
      uVar48 = 0;
      uVar47 = 0;
      lVar46 = 0;
      puVar42 = local_50;
      do {
        bVar29 = 1 - (byte)*(int *)(puVar42 + -0xa1);
        bVar23 = 1 - (byte)*(int *)(puVar42 + -0xa5);
        uVar36 = (x->e_mbd).mb_to_left_edge << (bVar23 & 0x1f);
        uVar49 = (uint)puVar42[-1] * 0x10 + (iVar17 << (bVar23 & 0x1f)) + 0x30;
        uVar45 = local_7c << (bVar29 & 0x1f);
        uVar25 = (uint)(short)((local_40->mv[lVar19].as_int >> 0x10) << (bVar23 & 0x1f));
        if ((int)uVar25 < (int)uVar49) {
          uVar49 = uVar25;
        }
        uVar30 = (uint)*puVar42 * 0x10 + 0x30 + (local_80 << (bVar29 & 0x1f));
        if ((int)uVar25 < (int)(uVar36 + (uint)puVar42[-1] * -0x10 + -0x40)) {
          uVar49 = uVar36;
        }
        uVar25 = (uint)(short)(local_40->mv[lVar19].as_int << (bVar29 & 0x1f));
        if ((int)uVar25 < (int)uVar30) {
          uVar30 = uVar25;
        }
        if ((int)uVar25 < (int)(uVar45 + (uint)*puVar42 * -0x10 + -0x40)) {
          uVar30 = uVar45;
        }
        uVar48 = (uint)((uVar49 & 0xf) == 0) << ((byte)lVar46 & 0x1f) | uVar48;
        uVar47 = (uint)((uVar30 & 0xf) == 0) << ((byte)lVar46 & 0x1f) | uVar47;
        if (local_58->monochrome != '\0') break;
        puVar42 = puVar42 + 0xa30;
        bVar51 = lVar46 == 0;
        lVar46 = lVar46 + 1;
      } while (bVar51);
      piVar27 = (int *)(ulong)(uVar48 & local_84);
      uVar47 = uVar47 & uVar35;
    }
    uVar35 = uVar47;
    uVar47 = (uint)piVar27;
  } while (((bVar50) && ('\0' < local_40->ref_frame[1])) &&
          (bVar50 = lVar19 == 0, lVar19 = lVar19 + 1, bVar50));
  uVar48 = uVar35;
  if (('\0' < local_40->ref_frame[1]) && ((local_40->field_0xa8 & 2) != 0)) {
    uVar48 = 0;
    if (uVar35 != 1 || uVar47 != 0) {
      uVar48 = uVar35;
    }
    if ((local_40->interinter_comp).type != '\x03') {
      uVar48 = uVar35;
    }
  }
  local_c8._32_8_ = *(undefined8 *)(local_68->stride + 2);
  local_c8.rdcost = (int64_t)local_68->plane[2];
  local_c8.sse = *(int64_t *)local_68->stride;
  local_c8._0_8_ = local_68->plane[0];
  local_c8.dist = (int64_t)local_68->plane[1];
  lVar19 = (ulong)(uVar1 == '\0') * 2 + 1;
  pmVar14 = (x->e_mbd).plane;
  lVar46 = 0;
  do {
    pbVar20 = &pmVar14->dst;
    pbVar20->buf = *(uint8_t **)(&local_c8.rate + lVar46 * 2);
    pbVar20->stride = *(int *)((long)&local_c8.sse + lVar46 * 4);
    lVar46 = lVar46 + 1;
    pmVar14 = (macroblockd_plane *)(pbVar20 + 0x51);
  } while (lVar19 != lVar46);
  dst_bufs[0] = local_68;
  bsize_00 = (BLOCK_SIZE)orig_dst;
  dst_bufs[1] = orig_dst;
  if (local_58->enable_dual_filter == '\0') {
    pMVar11 = *local_78;
    uVar35 = (uint)(cpi->interp_search_flags).interp_filter_search_mask;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
      local_90 = (ulong)(cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      lVar46 = 0;
      iVar17 = av1_get_pred_context_switchable_interp(xd,0);
      iVar43 = 0x3bcc11;
      iVar18 = av1_get_pred_context_switchable_interp(xd,1);
      do {
        if ((*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[0][iVar17] +
                     lVar46 + (ulong)(uint)((int)local_90 * 0xc0)) <
             *(int *)(find_best_non_dual_interp_filter_thr + local_90 * 4)) &&
           (*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[0][iVar18] +
                    lVar46 + (ulong)(uint)((int)local_90 * 0xc0)) <
            *(int *)(find_best_non_dual_interp_filter_thr + local_90 * 4))) {
          uVar35 = uVar35 & (1 << ((byte)lVar46 & 0x1f) & 0x111U ^ 0x1ff);
        }
        lVar46 = lVar46 + 4;
      } while (lVar46 != 0xc);
    }
    uVar25 = uVar48 & uVar47;
    piVar27 = (int *)(ulong)uVar25;
    uVar49 = (cpi->interp_search_flags).default_interp_skip_flags;
    if (uVar25 != uVar49) {
      pMVar12 = (x->e_mbd).left_mbmi;
      pMVar10 = (x->e_mbd).above_mbmi;
      uVar24 = 0xff;
      uVar45 = 0xff;
      uVar36 = 0xff;
      if (pMVar10 != (MB_MODE_INFO *)0x0) {
        if ((pMVar10->field_0xa7 & 0x80) == 0) {
          uVar45 = 0xff;
          uVar36 = 0xff;
          if (pMVar10->ref_frame[0] < '\x01') goto LAB_003bcce8;
        }
        uVar36 = (pMVar10->interp_filters).as_int;
        uVar45 = uVar36 >> 0x10;
      }
LAB_003bcce8:
      if (pMVar12 == (MB_MODE_INFO *)0x0) {
        IVar38.y_filter = 0xff;
        IVar38.x_filter = 0;
      }
      else if (((pMVar12->field_0xa7 & 0x80) != 0) ||
              (IVar38.y_filter = 0xff, IVar38.x_filter = 0, '\0' < pMVar12->ref_frame[0])) {
        IVar38 = (pMVar12->interp_filters).as_filters;
        uVar24 = IVar38.x_filter;
      }
      uVar40 = (uint16_t)uVar45;
      bVar50 = (uVar36 & 0xffff) != 0xff;
      bVar51 = (uint16_t)uVar36 == IVar38.y_filter;
      uVar36 = 0;
      if ((cpi->sf).interp_sf.cb_pred_filter_search != 0) {
        uVar36 = ((uint)((x->e_mbd).mi_row + (x->e_mbd).mi_col) >>
                 ((byte)tile_data_00[0xec].tctx.intra_ext_tx_cdf[0][2][4][9] & 0x1f)) +
                 (cpi->common).current_frame.frame_number & 1;
      }
      uVar30 = 0;
      if (bVar51 && bVar50) {
        uVar30 = uVar36;
      }
      if (uVar40 == uVar24 && uVar45 != 0xff) {
        uVar30 = uVar36;
      }
      if ((bVar51 && bVar50 || uVar40 == uVar24 && uVar45 != 0xff) && uVar30 != 0) {
        if ((((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) ||
            ((uVar35 >> (uVar45 << 2 & 0x1c) & 1) != 0)) && (uVar40 != 0)) {
          interpolation_filter_rd
                    (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,
                     &rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,
                     (BUFFER_SET **)(ulong)(uVar45 << 2),(int)switchable_ctx,piVar27,
                     in_stack_fffffffffffffe58);
        }
        goto LAB_003bd1d1;
      }
    }
    if (((bsize != BLOCK_4X4) &&
        (((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar49 != uVar48)))) &&
       (((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar49 != uVar47)))) {
      ppBVar34 = (BUFFER_SET **)&DAT_00000004;
      while ((((uVar47 = (uint)ppBVar34, (cpi->sf).interp_sf.adaptive_interp_filter_search != 0 &&
               ((uVar35 >> (uVar47 & 0x1f) & 1) == 0)) ||
              ((interpolation_filter_rd
                          (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,
                           &rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,ppBVar34,
                           (int)switchable_ctx,piVar27,in_stack_fffffffffffffe58),
               (cpi->sf).interp_sf.skip_sharp_interp_filter_search == 0 ||
               ((uVar25 == (cpi->interp_search_flags).default_interp_skip_flags ||
                ((pMVar11->interp_filters).as_int != 0x10001)))))) && (uVar47 < 5))) {
        ppBVar34 = (BUFFER_SET **)(ulong)(uVar47 + 4);
      }
      goto LAB_003bd1d1;
    }
    uVar35 = uVar35 & 0x110;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) {
      uVar35 = 0x110;
    }
    uVar24 = 1;
  }
  else {
    if ((cpi->sf).interp_sf.use_fast_interpolation_filter_search != 0) {
      bVar23 = (*local_78)->mode - 0x10;
      if ((bVar23 < 9) && ((0x179U >> (bVar23 & 0x1f) & 1) != 0)) {
        uVar49 = 0xff;
        iVar17 = 0;
        uVar35 = 0xff;
      }
      else {
        pMVar11 = (x->e_mbd).left_mbmi;
        pMVar12 = (x->e_mbd).above_mbmi;
        uVar24 = 0xff;
        uVar49 = 0xff;
        uVar35 = 0xff;
        if (pMVar12 != (MB_MODE_INFO *)0x0) {
          if ((pMVar12->field_0xa7 & 0x80) == 0) {
            uVar49 = 0xff;
            uVar35 = 0xff;
            if (pMVar12->ref_frame[0] < '\x01') goto LAB_003bcd5a;
          }
          uVar35 = (pMVar12->interp_filters).as_int;
          uVar49 = uVar35 >> 0x10;
        }
LAB_003bcd5a:
        if (pMVar11 == (MB_MODE_INFO *)0x0) {
          IVar37.y_filter = 0xff;
          IVar37.x_filter = 0;
        }
        else if (((pMVar11->field_0xa7 & 0x80) != 0) ||
                (IVar37.y_filter = 0xff, IVar37.x_filter = 0, '\0' < pMVar11->ref_frame[0])) {
          IVar37 = (pMVar11->interp_filters).as_filters;
          uVar24 = IVar37.x_filter;
        }
        bVar50 = (uint16_t)uVar49 == uVar24;
        bVar51 = (uVar35 & 0xffff) != 0xff;
        bVar52 = (uint16_t)uVar35 == IVar37.y_filter;
        uVar25 = 0;
        if ((cpi->sf).interp_sf.cb_pred_filter_search != 0) {
          uVar25 = ((uint)((x->e_mbd).mi_row + (x->e_mbd).mi_col) >>
                   ((byte)tile_data_00[0xec].tctx.intra_ext_tx_cdf[0][2][4][9] & 0x1f)) +
                   (cpi->common).current_frame.frame_number & 1;
        }
        uVar36 = 0;
        if (bVar52 && bVar51) {
          uVar36 = uVar25;
        }
        if (bVar50 && uVar49 != 0xff) {
          uVar36 = uVar25;
        }
        iVar17 = uVar36 * ((uint)(bVar50 && uVar49 != 0xff) + (uint)(bVar52 && bVar51) * 2);
      }
      if ((char)iVar17 == '\0') {
        switchable_ctx_00 = local_60;
        if ((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0) {
          switchable_ctx_00 = piVar27;
        }
        ppBVar34 = (BUFFER_SET **)0x0;
        dst_bufs_00 = (BUFFER_SET **)0x2;
        do {
          iVar21 = interpolation_filter_rd
                             (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma
                              ,&rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,dst_bufs_00,
                              (int)switchable_ctx,switchable_ctx_00,in_stack_fffffffffffffe58);
          uVar35 = (uint)dst_bufs_00;
          if (iVar21 != 0) {
            ppBVar34 = dst_bufs_00;
          }
          dst_bufs_00 = (BUFFER_SET **)(ulong)(uVar35 - 1);
          switchable_ctx_00 = piVar27;
        } while (1 < uVar35);
        uVar35 = uVar48;
        if ((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) != 0) {
          uVar35 = (cpi->interp_search_flags).default_interp_skip_flags;
        }
        uVar47 = (int)ppBVar34 + 6;
        do {
          interpolation_filter_rd
                    (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,
                     &rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,
                     (BUFFER_SET **)(ulong)uVar47,(int)switchable_ctx,(int *)(ulong)uVar35,
                     in_stack_fffffffffffffe58);
          uVar47 = uVar47 - 3;
          uVar35 = uVar48;
        } while ((int)ppBVar34 + 3 <= (int)uVar47);
      }
      else {
        if ((char)iVar17 == '\x02') {
          uVar35 = (uint)av1_interp_dual_filt_mask[1][uVar35 & 0xffff];
        }
        else if (iVar17 == 1) {
          uVar35 = (uint)av1_interp_dual_filt_mask[0][uVar49];
        }
        else {
          uVar35 = 1 << ((char)uVar35 * '\x03' + (char)uVar49 & 0x1fU);
        }
        find_best_interp_rd_facade
                  (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,&rd_stats,
                   (RD_STATS *)switchable_rate,(int *)dst_bufs,(BUFFER_SET **)switchable_ctx,
                   (int *)(ulong)(uVar48 & uVar47),uVar35 & 0x1fe,0,iVar43);
      }
      goto LAB_003bd1d1;
    }
    piVar27 = (int *)(ulong)(uVar48 & uVar47);
    uVar24 = 0;
    uVar35 = 0x1fe;
  }
  find_best_interp_rd_facade
            (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,&rd_stats,
             (RD_STATS *)switchable_rate,(int *)dst_bufs,(BUFFER_SET **)switchable_ctx,piVar27,
             uVar35,uVar24,iVar43);
LAB_003bd1d1:
  pBVar16 = dst_bufs[1];
  pBVar15 = dst_bufs[0];
  dst_bufs[0] = dst_bufs[1];
  dst_bufs[1] = pBVar15;
  local_c8._32_8_ = *(undefined8 *)(pBVar16->stride + 2);
  local_c8.rdcost = (int64_t)pBVar16->plane[2];
  local_c8.sse = *(int64_t *)pBVar16->stride;
  local_c8._0_8_ = pBVar16->plane[0];
  local_c8.dist = (int64_t)pBVar16->plane[1];
  pmVar14 = (x->e_mbd).plane;
  lVar46 = 0;
  do {
    pbVar20 = &pmVar14->dst;
    pbVar20->buf = *(uint8_t **)(&local_c8.rate + lVar46 * 2);
    pbVar20->stride = *(int *)((long)&local_c8.sse + lVar46 * 4);
    lVar46 = lVar46 + 1;
    pmVar14 = (macroblockd_plane *)(pbVar20 + 0x51);
  } while (lVar19 != lVar46);
  if (x->recalc_luma_mc_data == 1) {
    av1_enc_build_inter_predictor
              (local_70,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize,0,0);
  }
  uVar35 = (uint)((ulong)rd_stats_luma.sse >> 4);
  x->pred_sse[cVar2] = uVar35;
  if ((cpi->sf).interp_sf.use_interp_filter != 0) {
    iVar17 = args->interp_filter_stats_idx;
    lVar19 = (long)iVar17;
    if (lVar19 < 0x80) {
      iVar21 = *rd;
      uVar6 = *(undefined2 *)pMVar8->ref_frame;
      CVar5 = (pMVar8->interinter_comp).type;
      uVar7 = *(ushort *)&pMVar8->field_0xa7;
      uVar13 = *(undefined8 *)pMVar8->mv;
      local_98[lVar19].filters = pMVar8->interp_filters;
      *(undefined8 *)local_98[lVar19].mv = uVar13;
      *(undefined2 *)local_98[lVar19].ref_frames = uVar6;
      local_98[lVar19].comp_type = CVar5;
      local_98[lVar19].compound_idx = uVar7 >> 9 & 1;
      local_98[lVar19].rd = iVar21;
      local_98[lVar19].pred_sse = uVar35;
      iVar17 = iVar17 + 1;
    }
    args->interp_filter_stats_idx = iVar17;
  }
  return 0;
}

Assistant:

int64_t av1_interpolation_filter_search(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const tmp_dst, const BUFFER_SET *const orig_dst,
    int64_t *const rd, int *const switchable_rate, int *skip_build_pred,
    HandleInterModeArgs *args, int64_t ref_best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int need_search = av1_is_interp_needed(xd);
  const int ref_frame = xd->mi[0]->ref_frame[0];
  RD_STATS rd_stats_luma, rd_stats;

  // Initialization of rd_stats structures with default values
  av1_init_rd_stats(&rd_stats_luma);
  av1_init_rd_stats(&rd_stats);

  int match_found_idx = -1;
  const InterpFilter assign_filter = cm->features.interp_filter;

  match_found_idx = find_interp_filter_match(
      mbmi, cpi, assign_filter, need_search, args->interp_filter_stats,
      args->interp_filter_stats_idx);

  if (match_found_idx != -1) {
    *rd = args->interp_filter_stats[match_found_idx].rd;
    x->pred_sse[ref_frame] =
        args->interp_filter_stats[match_found_idx].pred_sse;
    *skip_build_pred = 0;
    return 0;
  }

  int switchable_ctx[2];
  switchable_ctx[0] = av1_get_pred_context_switchable_interp(xd, 0);
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd, 1);
  *switchable_rate =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  // Do MC evaluation for default filter_type.
  // Luma MC
  interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                       &rd_stats_luma, *skip_build_pred);

#if CONFIG_COLLECT_RD_STATS == 3
  RD_STATS rd_stats_y;
  av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize, INT64_MAX);
  PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
  // Chroma MC
  if (num_planes > 1) {
    interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_U, AOM_PLANE_V,
                         &rd_stats, *skip_build_pred);
  }
  *skip_build_pred = 1;

  av1_merge_rd_stats(&rd_stats, &rd_stats_luma);

  assert(rd_stats.rate >= 0);

  *rd = RDCOST(x->rdmult, *switchable_rate + rd_stats.rate, rd_stats.dist);
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  if (assign_filter != SWITCHABLE || match_found_idx != -1) {
    return 0;
  }
  if (!need_search) {
    int_interpfilters filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    assert(mbmi->interp_filters.as_int == filters.as_int);
    (void)filters;
    return 0;
  }
  if (args->modelled_rd != NULL) {
    if (has_second_ref(mbmi)) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      MV_REFERENCE_FRAME *refs = mbmi->ref_frame;
      const int mode0 = compound_ref0_mode(mbmi->mode);
      const int mode1 = compound_ref1_mode(mbmi->mode);
      const int64_t mrd = AOMMIN(args->modelled_rd[mode0][ref_mv_idx][refs[0]],
                                 args->modelled_rd[mode1][ref_mv_idx][refs[1]]);
      if ((*rd >> 1) > mrd && ref_best_rd < INT64_MAX) {
        return INT64_MAX;
      }
    }
  }

  x->recalc_luma_mc_data = 0;
  // skip_flag=xx (in binary form)
  // Setting 0th flag corresonds to skipping luma MC and setting 1st bt
  // corresponds to skipping chroma MC  skip_flag=0 corresponds to "Don't skip
  // luma and chroma MC"  Skip flag=1 corresponds to "Skip Luma MC only"
  // Skip_flag=2 is not a valid case
  // skip_flag=3 corresponds to "Skip both luma and chroma MC"
  int skip_hor = interp_search_flags->default_interp_skip_flags;
  int skip_ver = interp_search_flags->default_interp_skip_flags;
  calc_interp_skip_pred_flag(x, cpi, &skip_hor, &skip_ver);

  // do interp_filter search
  restore_dst_buf(xd, *tmp_dst, num_planes);
  const BUFFER_SET *dst_bufs[2] = { tmp_dst, orig_dst };
  // Evaluate dual interp filters
  if (cm->seq_params->enable_dual_filter) {
    if (cpi->sf.interp_sf.use_fast_interpolation_filter_search) {
      fast_dual_interp_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx, skip_hor, skip_ver);
    } else {
      // Use full interpolation filter search
      uint16_t allowed_interp_mask = ALLOW_ALL_INTERP_FILT_MASK;
      // REG_REG filter type is evaluated beforehand, so loop is repeated over
      // REG_SMOOTH to SHARP_SHARP for full interpolation filter search
      reset_interp_filter_allowed_mask(&allowed_interp_mask, REG_REG);
      find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx,
                                 (skip_hor & skip_ver), allowed_interp_mask, 0);
    }
  } else {
    // Evaluate non-dual interp filters
    find_best_non_dual_interp_filter(
        x, cpi, tile_data, bsize, orig_dst, rd, &rd_stats_luma, &rd_stats,
        switchable_rate, dst_bufs, switchable_ctx, skip_ver, skip_hor);
  }
  swap_dst_buf(xd, dst_bufs, num_planes);
  // Recompute final MC data if required
  if (x->recalc_luma_mc_data == 1) {
    // Recomputing final luma MC data is required only if the same was skipped
    // in either of the directions  Condition below is necessary, but not
    // sufficient
    assert((skip_hor == 1) || (skip_ver == 1));
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  // save search results
  if (cpi->sf.interp_sf.use_interp_filter) {
    assert(match_found_idx == -1);
    args->interp_filter_stats_idx = save_interp_filter_search_stat(
        mbmi, *rd, x->pred_sse[ref_frame], args->interp_filter_stats,
        args->interp_filter_stats_idx);
  }
  return 0;
}